

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O2

void __thiscall iaf_psc_alpha::calibrate(iaf_psc_alpha *this)

{
  double dVar1;
  iaf_psc_alpha_param *piVar2;
  iaf_psc_alpha *this_00;
  double h;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  h = this->dt * 1000.0;
  dVar3 = -h;
  this_00 = this;
  dVar4 = exp(dVar3 / this->param->tau_ex_);
  this->P22_ex_ = dVar4;
  this->P11_ex_ = dVar4;
  dVar4 = exp(dVar3 / this->param->tau_in_);
  this->P22_in_ = dVar4;
  this->P11_in_ = dVar4;
  dVar4 = exp(dVar3 / this->param->Tau_);
  this->P33_ = dVar4;
  dVar4 = expm1(dVar3 / this->param->Tau_);
  this->expm1_tau_m_ = dVar4;
  dVar4 = this->param->Tau_;
  dVar1 = this->param->C_;
  dVar3 = expm1(dVar3 / dVar4);
  this->P30_ = dVar3 * (-dVar4 / dVar1);
  this->P21_ex_ = this->P11_ex_ * h;
  this->P21_in_ = this->P11_in_ * h;
  piVar2 = this->param;
  dVar4 = propagator_31(this_00,piVar2->tau_ex_,piVar2->Tau_,piVar2->C_,h);
  this->P31_ex_ = dVar4;
  piVar2 = this->param;
  dVar4 = propagator_32(this_00,piVar2->tau_ex_,piVar2->Tau_,piVar2->C_,h);
  this->P32_ex_ = dVar4;
  piVar2 = this->param;
  dVar4 = propagator_31(this_00,piVar2->tau_in_,piVar2->Tau_,piVar2->C_,h);
  this->P31_in_ = dVar4;
  piVar2 = this->param;
  dVar4 = propagator_32(this_00,piVar2->tau_in_,piVar2->Tau_,piVar2->C_,h);
  this->P32_in_ = dVar4;
  piVar2 = this->param;
  auVar5._0_8_ = piVar2->tau_ex_;
  auVar5._8_8_ = piVar2->tau_in_;
  auVar5 = divpd(_DAT_0012b850,auVar5);
  this->EPSCInitialValue_ = (double)auVar5._0_8_;
  this->IPSCInitialValue_ = (double)auVar5._8_8_;
  this->RefractoryCounts_ = (int)(piVar2->TauR_ / h);
  return;
}

Assistant:

void iaf_psc_alpha::calibrate() {
    double h = dt*1000.0;
    
    // these P are independent
    P11_ex_ = P22_ex_ = std::exp(   -h / param->tau_ex_ );
    P11_in_ = P22_in_ = std::exp( -h / param->tau_in_ );

    P33_ = std::exp( -h / param->Tau_ );

    expm1_tau_m_ = std::expm1( -h / param->Tau_ );

    // these depend on the above. Please do not change the order.
    P30_ = -param->Tau_ / param->C_ * std::expm1( -h / param->Tau_ );
    P21_ex_ = h * P11_ex_;
    P21_in_ = h * P11_in_;

    // these are determined according to a numeric stability criterion
    P31_ex_ = propagator_31( param->tau_ex_, param->Tau_, param->C_, h );
    P32_ex_ = propagator_32( param->tau_ex_, param->Tau_, param->C_, h );
    P31_in_ = propagator_31( param->tau_in_, param->Tau_, param->C_, h );
    P32_in_ = propagator_32( param->tau_in_, param->Tau_, param->C_, h );

    EPSCInitialValue_ = 1.0 * M_E / param->tau_ex_;
    IPSCInitialValue_ = 1.0 * M_E / param->tau_in_;

    RefractoryCounts_ = param->TauR_/h;
}